

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O2

void verifyOrthonormal<float>(Matrix33<float> *A)

{
  uint __line;
  long lVar1;
  long lVar2;
  float (*__return_storage_ptr__) [3];
  char *__assertion;
  Matrix33<float> prod;
  Matrix33<float> local_3c;
  
  Imath_2_5::Matrix33<float>::transposed(A);
  __return_storage_ptr__ = (float (*) [3])&prod;
  Imath_2_5::Matrix33<float>::operator*((Matrix33<float> *)__return_storage_ptr__,A,&local_3c);
  lVar1 = 0;
  do {
    if (lVar1 == 3) {
      return;
    }
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      if (lVar1 == lVar2) {
        if (1.1920929e-05 <= ABS(*(float *)((long)prod.x + lVar1 * 0x10) + -1.0)) {
          __assertion = "std::abs (prod[i][j] - 1) < valueEps";
          __line = 0x3a;
LAB_0013cdf0:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testTinySVD.cpp"
                        ,__line,"void verifyOrthonormal(const Imath_2_5::Matrix33<T> &) [T = float]"
                       );
        }
      }
      else if (1.1920929e-05 <= ABS((*(float (*) [3])*__return_storage_ptr__)[lVar2])) {
        __assertion = "std::abs (prod[i][j]) < valueEps";
        __line = 0x3c;
        goto LAB_0013cdf0;
      }
    }
    lVar1 = lVar1 + 1;
    __return_storage_ptr__ = __return_storage_ptr__ + 1;
  } while( true );
}

Assistant:

void
verifyOrthonormal (const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A)
{
    const T valueEps = T(100) * std::numeric_limits<T>::epsilon();

    const IMATH_INTERNAL_NAMESPACE::Matrix33<T> prod = A * A.transposed();
    for (int i = 0; i < 3; ++i)
    {
        for (int j = 0; j < 3; ++j)
        {
            if (i == j)
                assert (std::abs (prod[i][j] - 1) < valueEps);
            else
                assert (std::abs (prod[i][j]) < valueEps);
        }
    }
}